

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeWithSameShape(Builder *this,Id component,Id otherType)

{
  Instruction *this_00;
  Id IVar1;
  Id IVar2;
  Id IVar3;
  Id use;
  
  this_00 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
            super__Vector_impl_data._M_start[otherType];
  if (this_00->opCode == OpTypeCooperativeMatrixKHR) {
    IVar1 = Instruction::getIdOperand(this_00,1);
    IVar2 = Instruction::getIdOperand(this_00,2);
    IVar3 = Instruction::getIdOperand(this_00,3);
    use = Instruction::getIdOperand(this_00,4);
    IVar1 = makeCooperativeMatrixTypeKHR(this,component,IVar1,IVar2,IVar3,use);
    return IVar1;
  }
  if (this_00->opCode == OpTypeCooperativeMatrixNV) {
    IVar1 = Instruction::getIdOperand(this_00,1);
    IVar2 = Instruction::getIdOperand(this_00,2);
    IVar3 = Instruction::getIdOperand(this_00,3);
    IVar1 = makeCooperativeMatrixTypeNV(this,component,IVar1,IVar2,IVar3);
    return IVar1;
  }
  __assert_fail("instr->getOpCode() == OpTypeCooperativeMatrixKHR",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                ,0x201,"Id spv::Builder::makeCooperativeMatrixTypeWithSameShape(Id, Id)");
}

Assistant:

Id Builder::makeCooperativeMatrixTypeWithSameShape(Id component, Id otherType)
{
    Instruction* instr = module.getInstruction(otherType);
    if (instr->getOpCode() == OpTypeCooperativeMatrixNV) {
        return makeCooperativeMatrixTypeNV(component, instr->getIdOperand(1), instr->getIdOperand(2), instr->getIdOperand(3));
    } else {
        assert(instr->getOpCode() == OpTypeCooperativeMatrixKHR);
        return makeCooperativeMatrixTypeKHR(component, instr->getIdOperand(1), instr->getIdOperand(2), instr->getIdOperand(3), instr->getIdOperand(4));
    }
}